

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O1

int __thiscall QFile::copy(QFile *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  QFilePrivate *this_00;
  bool bVar1;
  FileError FVar2;
  int iVar3;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  QArrayData *dst_00;
  long in_FS_OFFSET;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFilePrivate *)(this->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d;
  dst_00 = (QArrayData *)&local_40;
  src_01 = (EVP_PKEY_CTX *)this;
  (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0x1d])();
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      src_01 = (EVP_PKEY_CTX *)0x2;
      dst_00 = &(local_40.d.d)->super_QArrayData;
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_40.d.size == 0) {
    copy((EVP_PKEY_CTX *)dst_00,src_01);
  }
  else {
    bVar1 = QFileInfo::exists((QString *)dst);
    if (bVar1) {
      QMetaObject::tr(&local_40,&staticMetaObject,"Destination file exists",(char *)0x0,-1);
      QFileDevicePrivate::setError((QFileDevicePrivate *)this_00,CopyError,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      QFileDevice::unsetError(&this->super_QFileDevice);
      (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xe])(this);
      FVar2 = QFileDevice::error(&this->super_QFileDevice);
      if (FVar2 == NoError) {
        iVar3 = QFilePrivate::copy(this_00,dst,src_00);
        goto LAB_00237a5a;
      }
    }
  }
  iVar3 = 0;
LAB_00237a5a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool
QFile::copy(const QString &newName)
{
    Q_D(QFile);
    if (fileName().isEmpty()) {
        qWarning("QFile::copy: Empty or null file name");
        return false;
    }
    if (QFile::exists(newName)) {
        // ### Race condition. If a file is moved in after this, it /will/ be
        // overwritten. On Unix, the proper solution is to use hardlinks:
        // return ::link(old, new) && ::remove(old); See also rename().
        d->setError(QFile::CopyError, tr("Destination file exists"));
        return false;
    }
    unsetError();
    close();
    if (error() == QFile::NoError)
        return d->copy(newName);
    return false;
}